

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O2

ProcessLocation * __thiscall
pstack::Procman::StackFrame::scopeIP
          (ProcessLocation *__return_storage_ptr__,StackFrame *this,Process *proc)

{
  element_type *peVar1;
  CIE *pCVar2;
  Addr address_;
  undefined1 local_40 [8];
  ProcessLocation location;
  
  address_ = (this->regs).rip;
  if (address_ == 0) {
    address_ = 0;
  }
  else if ((this->mechanism != MACHINEREGS) && (this->isSignalTrampoline != true)) {
    ProcessLocation::ProcessLocation((ProcessLocation *)local_40,proc,address_);
    pCVar2 = ProcessLocation::cie((ProcessLocation *)local_40);
    peVar1 = location.codeloc.
             super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((pCVar2 == (CIE *)0x0) || (pCVar2[0xd] != (CIE)0x1)) {
      ProcessLocation::ProcessLocation(__return_storage_ptr__,proc,address_ - 1);
    }
    else {
      __return_storage_ptr__->location_ = (Addr)local_40;
      location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->codeloc).
      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)location.location_;
      (__return_storage_ptr__->codeloc).
      super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
      location.location_ = 0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&location.codeloc);
    return __return_storage_ptr__;
  }
  ProcessLocation::ProcessLocation(__return_storage_ptr__,proc,address_);
  return __return_storage_ptr__;
}

Assistant:

ProcessLocation
StackFrame::scopeIP(Process &proc) const
{
    // For a return address on the stack, it normally represents the next
    // instruction after a call. For functions that don't return, this might
    // land outside the caller function - so we subtract one, putting us in the
    // middle of the call instruction. This will also improve source line
    // details, as the actual return address is likely on the line of code
    // *after* the call rather than at it.
    //
    // There are two exceptions: first, the instruction pointer we grab from
    // the process's register state - this is the currently executing
    // instruction, so accurately reflects the position in the top stack frame.
    //
    // The other is for signal trampolines - In this case, the return address
    // has been synthesized to be the entrypoint of a function (eg,
    // __restore_rt) to handle return from the signal handler, and will be the
    // first instruction in the function - there's no previous call instruction
    // to point at, so we use it directly.
    auto raw = rawIP();
    if (raw == 0)
       return { proc, raw };
    if (mechanism == UnwindMechanism::MACHINEREGS)
       return { proc, raw };
    if (isSignalTrampoline)
       return { proc, raw };
    ProcessLocation location(proc, raw);

    const auto *lcie = location.cie();
    if (lcie != nullptr && lcie->isSignalHandler)
       return location;
    return {proc, raw - 1};
}